

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double empirical_discrete_pdf(double x,int a,double *b,double *c)

{
  double dVar1;
  double dVar2;
  double pdf;
  int i;
  double *c_local;
  double *b_local;
  int a_local;
  double x_local;
  
  pdf._4_4_ = 0;
  while( true ) {
    if (a < pdf._4_4_) {
      return 0.0;
    }
    if ((x == c[pdf._4_4_]) && (!NAN(x) && !NAN(c[pdf._4_4_]))) break;
    pdf._4_4_ = pdf._4_4_ + 1;
  }
  dVar1 = b[pdf._4_4_];
  dVar2 = r8vec_sum(a,b);
  return dVar1 / dVar2;
}

Assistant:

double empirical_discrete_pdf ( double x, int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_PDF evaluates the Empirical Discrete PDF.
//
//  Discussion:
//
//    A set of A values C(1:A) are assigned nonnegative weights B(1:A),
//    with at least one B nonzero.  The probability of C(I) is the
//    value of B(I) divided by the sum of the weights.
//
//    The C's must be distinct, and given in ascending order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_PDF, the value of the PDF.
//
{
  int i;
  double pdf;

  for ( i = 0; i <= a; i++ )
  {
    if ( x == c[i] )
    {
      pdf = b[i] / r8vec_sum ( a, b );
      return pdf;
    }
  }

  pdf = 0.0;

  return pdf;
}